

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_ecmult_multi(secp256k1_scratch *scratch,secp256k1_ecmult_multi_func ecmult_multi)

{
  ulong uVar1;
  size_t sVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  uint uVar12;
  secp256k1_ge *psVar13;
  ulong uVar14;
  secp256k1_scalar *psVar15;
  uint uVar16;
  secp256k1_gej *psVar17;
  secp256k1_gej *psVar18;
  ulong uVar19;
  uint64_t *puVar20;
  secp256k1_ge *psVar21;
  uint64_t *puVar22;
  char *pcVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  byte bVar28;
  ecmult_multi_data data;
  secp256k1_gej r;
  secp256k1_gej ptgj;
  secp256k1_scalar t1;
  secp256k1_scalar t0;
  secp256k1_ge ptg;
  ulong uStack_11f8;
  uint64_t auStack_11f0 [3];
  secp256k1_scalar local_11d8;
  secp256k1_scalar local_11b8;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  secp256k1_gej t1p;
  secp256k1_gej r2;
  secp256k1_scalar tmp2;
  secp256k1_scalar tmp1;
  secp256k1_ge ptg_4;
  secp256k1_ge pt [32];
  secp256k1_gej actual;
  secp256k1_gej expected;
  
  bVar28 = 0;
  data.sc = &local_11d8;
  data.pt = pt;
  iVar25 = 0;
  iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,(secp256k1_scalar *)0x0,
                          ecmult_multi_callback,&data,0);
  if (iVar6 == 0) {
    pcVar23 = 
    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, NULL, ecmult_multi_callback, &data, 0)"
    ;
    uVar11 = 0x1229;
  }
  else {
    for (; iVar25 < COUNT; iVar25 = iVar25 + 1) {
      testutil_random_scalar_order(&local_11d8);
      testutil_random_scalar_order(&local_11b8);
      testutil_random_ge_test(&ptg);
      ptgj.infinity = ptg.infinity;
      ptgj.x.n[4] = ptg.x.n[4];
      ptgj.x.n[2] = ptg.x.n[2];
      ptgj.x.n[3] = ptg.x.n[3];
      ptgj.x.n[0] = ptg.x.n[0];
      ptgj.x.n[1] = ptg.x.n[1];
      ptgj.y.n[4] = ptg.y.n[4];
      ptgj.y.n[2] = ptg.y.n[2];
      ptgj.y.n[3] = ptg.y.n[3];
      ptgj.y.n[0] = ptg.y.n[0];
      ptgj.y.n[1] = ptg.y.n[1];
      ptgj.z.n[0] = 1;
      ptgj.z.n[3] = 0;
      ptgj.z.n[4] = 0;
      ptgj.z.n[1] = 0;
      ptgj.z.n[2] = 0;
      lVar8 = 0xb;
      psVar13 = &ptg;
      psVar21 = pt;
      for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
        (psVar21->x).n[0] = (psVar13->x).n[0];
        psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar28 * -0x10 + 8);
        psVar21 = (secp256k1_ge *)((long)psVar21 + (ulong)bVar28 * -0x10 + 8);
      }
      psVar13 = &secp256k1_ge_const_g;
      psVar21 = pt + 1;
      for (; lVar8 != 0; lVar8 = lVar8 + -1) {
        (psVar21->x).n[0] = (psVar13->x).n[0];
        psVar13 = (secp256k1_ge *)((long)psVar13 + ((ulong)bVar28 * -2 + 1) * 8);
        psVar21 = (secp256k1_ge *)((long)psVar21 + (ulong)bVar28 * -0x10 + 8);
      }
      secp256k1_ecmult(&r2,&ptgj,&secp256k1_scalar_zero,&local_11d8);
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&local_11d8,ecmult_multi_callback,
                              &data,0);
      if (iVar6 == 0) {
        pcVar23 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &sc[0], ecmult_multi_callback, &data, 0)"
        ;
        uVar11 = 0x1239;
        goto LAB_00133d02;
      }
      iVar6 = secp256k1_gej_eq_var(&r,&r2);
      if (iVar6 == 0) {
        pcVar23 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
        uVar11 = 0x123a;
        goto LAB_00133d02;
      }
      secp256k1_ecmult(&r2,&ptgj,&local_11d8,&secp256k1_scalar_zero);
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&data,1);
      if (iVar6 == 0) {
        pcVar23 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1)"
        ;
        uVar11 = 0x123e;
        goto LAB_00133d02;
      }
      iVar6 = secp256k1_gej_eq_var(&r,&r2);
      if (iVar6 == 0) {
        pcVar23 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
        uVar11 = 0x123f;
        goto LAB_00133d02;
      }
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                              ecmult_multi_false_callback,&data,1);
      if (iVar6 != 0) {
        pcVar23 = 
        "test condition failed: !ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_false_callback, &data, 1)"
        ;
        uVar11 = 0x1242;
        goto LAB_00133d02;
      }
      secp256k1_ecmult(&r2,&ptgj,&local_11d8,&local_11b8);
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&data,2);
      if (iVar6 == 0) {
        pcVar23 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2)"
        ;
        uVar11 = 0x1246;
        goto LAB_00133d02;
      }
      iVar6 = secp256k1_gej_eq_var(&r,&r2);
      if (iVar6 == 0) {
        pcVar23 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
        uVar11 = 0x1247;
        goto LAB_00133d02;
      }
      secp256k1_ecmult(&r2,&ptgj,&local_11d8,&local_11b8);
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&local_11b8,ecmult_multi_callback,
                              &data,1);
      if (iVar6 == 0) {
        pcVar23 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &sc[1], ecmult_multi_callback, &data, 1)"
        ;
        uVar11 = 0x124b;
        goto LAB_00133d02;
      }
      iVar6 = secp256k1_gej_eq_var(&r,&r2);
      if (iVar6 == 0) {
        pcVar23 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
        uVar11 = 0x124c;
        goto LAB_00133d02;
      }
    }
    lVar8 = 0xb;
    for (iVar6 = 0; iVar6 < COUNT; iVar6 = iVar6 + 1) {
      lVar7 = 0;
      while (lVar7 != 3) {
        psVar15 = &local_11d8;
        for (lVar24 = 0x50; lVar24 != 0xb50; lVar24 = lVar24 + 0x58) {
          testutil_random_scalar_order(psVar15);
          *(undefined4 *)((long)pt[0].x.n + lVar24) = 1;
          *(undefined8 *)((long)ptg_4.x.n + lVar24 + 8) = 0;
          *(undefined8 *)((long)ptg_4.x.n + lVar24 + 0x10) = 0;
          *(undefined8 *)((long)ptg_4.x.n + lVar24 + 0x18) = 0;
          *(undefined8 *)((long)ptg_4.x.n + lVar24 + 0x20) = 0;
          *(undefined8 *)((long)ptg_4.y.n + lVar24) = 0;
          *(undefined8 *)((long)ptg_4.y.n + lVar24 + 8) = 0;
          *(undefined8 *)((long)ptg_4.y.n + lVar24 + 0x10) = 0;
          *(undefined8 *)((long)ptg_4.y.n + lVar24 + 0x18) = 0;
          *(undefined8 *)((long)ptg_4.y.n + lVar24 + 0x20) = 0;
          *(undefined8 *)((long)(&ptg_4.y + 1) + lVar24) = 0;
          psVar15 = psVar15 + 1;
        }
        iVar25 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                                 ecmult_multi_callback,&data,(&DAT_00153750)[lVar7]);
        if (iVar25 == 0) {
          pcVar23 = 
          "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
          ;
          uVar11 = 0x125a;
          goto LAB_00133d02;
        }
        lVar7 = lVar7 + 1;
        if (r.infinity == 0) {
          pcVar23 = "test condition failed: secp256k1_gej_is_infinity(&r)";
          uVar11 = 0x125b;
          goto LAB_00133d02;
        }
      }
      lVar7 = 0;
      while (lVar7 != 3) {
        psVar13 = pt;
        for (lVar24 = 0; lVar24 != 0x400; lVar24 = lVar24 + 0x20) {
          testutil_random_ge_test((secp256k1_ge *)&ptgj);
          psVar18 = &ptgj;
          psVar21 = psVar13;
          for (lVar9 = lVar8; lVar9 != 0; lVar9 = lVar9 + -1) {
            (psVar21->x).n[0] = (psVar18->x).n[0];
            psVar18 = (secp256k1_gej *)((long)psVar18 + (ulong)bVar28 * -0x10 + 8);
            psVar21 = (secp256k1_ge *)((long)psVar21 + (ulong)bVar28 * -0x10 + 8);
          }
          *(undefined8 *)((long)local_11d8.d + lVar24 + 0x10) = 0;
          *(undefined8 *)((long)local_11d8.d + lVar24 + 0x18) = 0;
          *(undefined8 *)((long)local_11d8.d + lVar24) = 0;
          *(undefined8 *)((long)local_11d8.d + lVar24 + 8) = 0;
          psVar13 = psVar13 + 1;
        }
        iVar25 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                                 ecmult_multi_callback,&data,(&DAT_00153750)[lVar7]);
        if (iVar25 == 0) {
          pcVar23 = 
          "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
          ;
          uVar11 = 0x1264;
          goto LAB_00133d02;
        }
        lVar7 = lVar7 + 1;
        if (r.infinity == 0) {
          pcVar23 = "test condition failed: secp256k1_gej_is_infinity(&r)";
          uVar11 = 0x1265;
          goto LAB_00133d02;
        }
      }
      lVar7 = 0;
      while (testutil_random_ge_test((secp256k1_ge *)&ptgj), lVar7 != 3) {
        psVar15 = &local_11d8;
        for (lVar24 = 0x58; lVar24 != 0xb58; lVar24 = lVar24 + 0xb0) {
          testutil_random_scalar_order(psVar15);
          secp256k1_scalar_negate(psVar15 + 1,psVar15);
          puVar22 = (uint64_t *)((long)pt[0].x.n + lVar24);
          psVar18 = &ptgj;
          puVar20 = (uint64_t *)((long)ptg_4.x.n + lVar24);
          for (lVar9 = lVar8; lVar10 = lVar8, psVar17 = &ptgj, lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar20 = (psVar18->x).n[0];
            psVar18 = (secp256k1_gej *)((long)psVar18 + (ulong)bVar28 * -0x10 + 8);
            puVar20 = puVar20 + (ulong)bVar28 * -2 + 1;
          }
          for (; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar22 = (psVar17->x).n[0];
            psVar17 = (secp256k1_gej *)((long)psVar17 + (ulong)bVar28 * -0x10 + 8);
            puVar22 = puVar22 + (ulong)bVar28 * -2 + 1;
          }
          psVar15 = psVar15 + 2;
        }
        sVar2 = (&DAT_00153750)[lVar7];
        iVar25 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                                 ecmult_multi_callback,&data,sVar2);
        if (iVar25 == 0) {
          pcVar23 = 
          "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
          ;
          uVar11 = 0x1271;
          goto LAB_00133d02;
        }
        if (r.infinity == 0) {
          pcVar23 = "test condition failed: secp256k1_gej_is_infinity(&r)";
          uVar11 = 0x1272;
          goto LAB_00133d02;
        }
        testutil_random_scalar_order(&local_11d8);
        psVar13 = pt;
        for (lVar24 = 0x20; lVar24 != 0x420; lVar24 = lVar24 + 0x40) {
          testutil_random_ge_test((secp256k1_ge *)&ptgj);
          uVar4 = local_11d8.d[3];
          uVar3 = local_11d8.d[1];
          *(uint64_t *)((long)auStack_11f0 + lVar24 + 8) = local_11d8.d[2];
          *(uint64_t *)((long)auStack_11f0 + lVar24 + 0x10) = uVar4;
          *(uint64_t *)((long)&uStack_11f8 + lVar24) = local_11d8.d[0];
          *(uint64_t *)((long)auStack_11f0 + lVar24) = uVar3;
          *(uint64_t *)((long)local_11d8.d + lVar24) = local_11d8.d[0];
          *(uint64_t *)((long)local_11d8.d + lVar24 + 8) = local_11d8.d[1];
          *(uint64_t *)((long)local_11d8.d + lVar24 + 0x10) = local_11d8.d[2];
          *(uint64_t *)((long)local_11d8.d + lVar24 + 0x18) = local_11d8.d[3];
          psVar18 = &ptgj;
          psVar21 = psVar13;
          for (lVar9 = lVar8; lVar9 != 0; lVar9 = lVar9 + -1) {
            (psVar21->x).n[0] = (psVar18->x).n[0];
            psVar18 = (secp256k1_gej *)((long)psVar18 + (ulong)bVar28 * -0x10 + 8);
            psVar21 = (secp256k1_ge *)((long)psVar21 + (ulong)bVar28 * -0x10 + 8);
          }
          secp256k1_ge_neg(psVar13 + 1,psVar13);
          psVar13 = psVar13 + 2;
        }
        iVar25 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                                 ecmult_multi_callback,&data,sVar2);
        if (iVar25 == 0) {
          pcVar23 = 
          "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
          ;
          uVar11 = 0x127e;
          goto LAB_00133d02;
        }
        lVar7 = lVar7 + 1;
        if (r.infinity == 0) {
          pcVar23 = "test condition failed: secp256k1_gej_is_infinity(&r)";
          uVar11 = 0x127f;
          goto LAB_00133d02;
        }
      }
      local_11d8.d[2] = 0;
      local_11d8.d[3] = 0;
      local_11d8.d[0] = 0;
      local_11d8.d[1] = 0;
      psVar18 = &ptgj;
      psVar13 = pt;
      for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
        (psVar13->x).n[0] = (psVar18->x).n[0];
        psVar18 = (secp256k1_gej *)((long)psVar18 + (ulong)bVar28 * -0x10 + 8);
        psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar28 * -0x10 + 8);
      }
      psVar15 = &local_11b8;
      for (lVar7 = 0x58; lVar7 != 0xb00; lVar7 = lVar7 + 0x58) {
        psVar18 = &ptgj;
        puVar22 = (uint64_t *)((long)pt[0].x.n + lVar7);
        for (lVar24 = lVar8; lVar24 != 0; lVar24 = lVar24 + -1) {
          *puVar22 = (psVar18->x).n[0];
          psVar18 = (secp256k1_gej *)((long)psVar18 + (ulong)bVar28 * -0x10 + 8);
          puVar22 = puVar22 + (ulong)bVar28 * -2 + 1;
        }
        testutil_random_scalar_order(psVar15);
        secp256k1_scalar_add(&local_11d8,&local_11d8,psVar15);
        secp256k1_scalar_negate(psVar15,psVar15);
        psVar15 = psVar15 + 1;
      }
      iVar25 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                               ecmult_multi_callback,&data,0x20);
      if (iVar25 == 0) {
        pcVar23 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 32)"
        ;
        uVar11 = 0x128d;
        goto LAB_00133d02;
      }
      if (r.infinity == 0) {
        pcVar23 = "test condition failed: secp256k1_gej_is_infinity(&r)";
        uVar11 = 0x128e;
        goto LAB_00133d02;
      }
    }
    iVar6 = 0;
    do {
      if (COUNT <= iVar6) {
        iVar6 = 0;
        goto LAB_001335dc;
      }
      r.infinity = 1;
      r.x.n[0] = 0;
      r.x.n[1] = 0;
      r.x.n[2] = 0;
      r.x.n[3] = 0;
      r.x.n[4] = 0;
      r.y.n[0] = 0;
      r.y.n[1] = 0;
      r.y.n[2] = 0;
      r.y.n[3] = 0;
      r.y.n[4] = 0;
      r.z.n[0] = 0;
      r.z.n[1] = 0;
      r.z.n[2] = 0;
      r.z.n[3] = 0;
      r.z.n[4] = 0;
      testutil_random_scalar_order(&local_11d8);
      psVar13 = pt;
      for (lVar8 = 0; uVar5 = local_11d8.d[3], uVar4 = local_11d8.d[2], uVar3 = local_11d8.d[1],
          lVar8 != 0x280; lVar8 = lVar8 + 0x20) {
        *(uint64_t *)((long)local_11d8.d + lVar8) = local_11d8.d[0];
        *(uint64_t *)((long)local_11d8.d + lVar8 + 8) = uVar3;
        *(uint64_t *)((long)local_11d8.d + lVar8 + 0x10) = uVar4;
        *(uint64_t *)((long)local_11d8.d + lVar8 + 0x18) = uVar5;
        testutil_random_ge_test((secp256k1_ge *)&ptgj);
        psVar18 = &ptgj;
        psVar21 = psVar13;
        for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
          (psVar21->x).n[0] = (psVar18->x).n[0];
          psVar18 = (secp256k1_gej *)((long)psVar18 + (ulong)bVar28 * -0x10 + 8);
          psVar21 = (secp256k1_ge *)((long)psVar21 + (ulong)bVar28 * -0x10 + 8);
        }
        secp256k1_gej_add_ge_var(&r,&r,psVar13,(secp256k1_fe *)0x0);
        psVar13 = psVar13 + 1;
      }
      secp256k1_ecmult(&r2,&r,&local_11d8,&secp256k1_scalar_zero);
      iVar25 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                               ecmult_multi_callback,&data,0x14);
      if (iVar25 == 0) {
        pcVar23 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20)"
        ;
        uVar11 = 0x12a0;
        goto LAB_00133d02;
      }
      iVar25 = secp256k1_gej_eq_var(&r,&r2);
      iVar6 = iVar6 + 1;
    } while (iVar25 != 0);
    pcVar23 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
    uVar11 = 0x12a1;
  }
LAB_00133d02:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar11,pcVar23);
  abort();
LAB_001335dc:
  if (COUNT <= iVar6) goto LAB_0013374e;
  t1p.x.n[2] = 0;
  t1p.x.n[3] = 0;
  t1p.x.n[0] = 0;
  t1p.x.n[1] = 0;
  testutil_random_ge_test(&ptg);
  psVar15 = &local_11d8;
  for (lVar8 = 0; lVar8 != 0x6e0; lVar8 = lVar8 + 0x58) {
    testutil_random_scalar_order(psVar15);
    psVar13 = &ptg;
    puVar22 = (uint64_t *)((long)pt[0].x.n + lVar8);
    for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar22 = (psVar13->x).n[0];
      psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar28 * -0x10 + 8);
      puVar22 = puVar22 + (ulong)bVar28 * -2 + 1;
    }
    secp256k1_scalar_add((secp256k1_scalar *)&t1p,(secp256k1_scalar *)&t1p,psVar15);
    psVar15 = psVar15 + 1;
  }
  ptgj.infinity = pt[0].infinity;
  ptgj.x.n[4] = pt[0].x.n[4];
  ptgj.x.n[2] = pt[0].x.n[2];
  ptgj.x.n[3] = pt[0].x.n[3];
  ptgj.x.n[0] = pt[0].x.n[0];
  ptgj.x.n[1] = pt[0].x.n[1];
  ptgj.y.n[4] = pt[0].y.n[4];
  ptgj.y.n[2] = pt[0].y.n[2];
  ptgj.y.n[3] = pt[0].y.n[3];
  ptgj.y.n[0] = pt[0].y.n[0];
  ptgj.y.n[1] = pt[0].y.n[1];
  ptgj.z.n[0] = 1;
  ptgj.z.n[3] = 0;
  ptgj.z.n[4] = 0;
  ptgj.z.n[1] = 0;
  ptgj.z.n[2] = 0;
  secp256k1_ecmult(&r2,&ptgj,(secp256k1_scalar *)&t1p,&secp256k1_scalar_zero);
  iVar25 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                           ecmult_multi_callback,&data,0x14);
  if (iVar25 == 0) {
    pcVar23 = 
    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20)"
    ;
    uVar11 = 0x12b5;
    goto LAB_00133d02;
  }
  iVar25 = secp256k1_gej_eq_var(&r,&r2);
  if (iVar25 == 0) {
    pcVar23 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
    uVar11 = 0x12b6;
    goto LAB_00133d02;
  }
  iVar6 = iVar6 + 1;
  goto LAB_001335dc;
LAB_0013374e:
  psVar13 = pt;
  for (lVar8 = 0; lVar8 != 0x280; lVar8 = lVar8 + 0x20) {
    testutil_random_scalar_order((secp256k1_scalar *)((long)local_11d8.d + lVar8));
    testutil_random_ge_test(psVar13);
    psVar13 = psVar13 + 1;
  }
  local_11d8.d[2] = 0;
  local_11d8.d[3] = 0;
  local_11d8.d[0] = 0;
  local_11d8.d[1] = 0;
  iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                          ecmult_multi_callback,&data,0x14);
  if (iVar6 == 0) {
    pcVar23 = 
    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20)"
    ;
    uVar11 = 0x12c0;
  }
  else {
    local_1148 = 0;
    uStack_1140 = 0;
    local_1158 = 0;
    uStack_1150 = 0;
    local_1168 = 0;
    uStack_1160 = 0;
    local_1178 = 0;
    uStack_1170 = 0;
    local_1188 = 0;
    uStack_1180 = 0;
    local_1198 = 0;
    uStack_1190 = 0;
    local_11b8.d[2] = 0;
    local_11b8.d[3] = 0;
    local_11b8.d[0] = 0;
    local_11b8.d[1] = 0;
    iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                            ecmult_multi_callback,&data,6);
    if (iVar6 == 0) {
      pcVar23 = 
      "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 6)"
      ;
      uVar11 = 0x12c5;
    }
    else {
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&data,5);
      if (iVar6 == 0) {
        pcVar23 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 5)"
        ;
        uVar11 = 0x12c6;
      }
      else {
        if (r.infinity != 0) {
          testutil_random_ge_test(&ptg_4);
          ptgj.infinity = ptg_4.infinity;
          ptgj.x.n[0] = ptg_4.x.n[0];
          ptgj.x.n[1] = ptg_4.x.n[1];
          ptgj.x.n[2] = ptg_4.x.n[2];
          ptgj.x.n[3] = ptg_4.x.n[3];
          ptgj.x.n[4] = ptg_4.x.n[4];
          ptgj.y.n[0] = ptg_4.y.n[0];
          ptgj.y.n[1] = ptg_4.y.n[1];
          ptgj.y.n[2] = ptg_4.y.n[2];
          ptgj.y.n[3] = ptg_4.y.n[3];
          ptgj.y.n[4] = ptg_4.y.n[4];
          ptgj.z.n[0] = 1;
          ptgj.z.n[1] = 0;
          ptgj.z.n[2] = 0;
          ptgj.z.n[3] = 0;
          ptgj.z.n[4] = 0;
          uVar19 = 0;
          do {
            if (uVar19 == 8) {
              return;
            }
            uVar1 = uVar19 + 1;
            uVar16 = (uint)uVar19;
            uVar26 = 0;
            while (uVar19 = uVar1, uVar26 != 8) {
              t0.d[1] = 0;
              t0.d[2] = 0;
              t0.d[3] = 0;
              t0.d[0] = uVar1 >> 1;
              secp256k1_scalar_cond_negate(&t0,uVar16 & 1);
              uVar19 = uVar26 + 1;
              t1.d[0] = uVar19 >> 1;
              t1.d[1] = 0;
              t1.d[2] = 0;
              t1.d[3] = 0;
              secp256k1_scalar_cond_negate(&t1,(uint)uVar26 & 1);
              secp256k1_ecmult((secp256k1_gej *)&ptg,&ptgj,&t0,&secp256k1_scalar_zero);
              secp256k1_ecmult(&t1p,&ptgj,&t1,&secp256k1_scalar_zero);
              uVar14 = 0;
              while (uVar26 = uVar19, uVar14 != 8) {
                uVar26 = uVar14 + 1;
                uVar12 = (uint)uVar14;
                uVar27 = 0;
                while (uVar14 = uVar26, uVar27 != 8) {
                  secp256k1_ge_set_gej(pt,(secp256k1_gej *)&ptg);
                  secp256k1_ge_set_gej(pt + 1,&t1p);
                  local_11d8.d[1] = 0;
                  local_11d8.d[2] = 0;
                  local_11d8.d[3] = 0;
                  local_11d8.d[0] = uVar26 >> 1;
                  secp256k1_scalar_cond_negate(&local_11d8,uVar12 & 1);
                  local_11b8.d[0] = uVar27 + 1 >> 1;
                  local_11b8.d[1] = 0;
                  local_11b8.d[2] = 0;
                  local_11b8.d[3] = 0;
                  secp256k1_scalar_cond_negate(&local_11b8,(uint)uVar27 & 1);
                  secp256k1_scalar_mul(&tmp1,&t0,&local_11d8);
                  secp256k1_scalar_mul(&tmp2,&t1,&local_11b8);
                  secp256k1_scalar_add(&tmp1,&tmp1,&tmp2);
                  secp256k1_ecmult(&expected,&ptgj,&tmp1,&secp256k1_scalar_zero);
                  iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&actual,
                                          &secp256k1_scalar_zero,ecmult_multi_callback,&data,2);
                  if (iVar6 == 0) {
                    pcVar23 = 
                    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &actual, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2)"
                    ;
                    uVar11 = 0x12f3;
                    goto LAB_00133d02;
                  }
                  iVar6 = secp256k1_gej_eq_var(&actual,&expected);
                  uVar27 = uVar27 + 1;
                  if (iVar6 == 0) {
                    pcVar23 = "test condition failed: secp256k1_gej_eq_var(&actual, &expected)";
                    uVar11 = 0x12f4;
                    goto LAB_00133d02;
                  }
                }
              }
            }
          } while( true );
        }
        pcVar23 = "test condition failed: secp256k1_gej_is_infinity(&r)";
        uVar11 = 0x12c7;
      }
    }
  }
  goto LAB_00133d02;
}

Assistant:

static void test_ecmult_multi(secp256k1_scratch *scratch, secp256k1_ecmult_multi_func ecmult_multi) {
    int ncount;
    secp256k1_scalar sc[32];
    secp256k1_ge pt[32];
    secp256k1_gej r;
    secp256k1_gej r2;
    ecmult_multi_data data;

    data.sc = sc;
    data.pt = pt;

    /* No points to multiply */
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, NULL, ecmult_multi_callback, &data, 0));

    /* Check 1- and 2-point multiplies against ecmult */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        secp256k1_gej ptgj;
        testutil_random_scalar_order(&sc[0]);
        testutil_random_scalar_order(&sc[1]);

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);
        pt[0] = ptg;
        pt[1] = secp256k1_ge_const_g;

        /* only G scalar */
        secp256k1_ecmult(&r2, &ptgj, &secp256k1_scalar_zero, &sc[0]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[0], ecmult_multi_callback, &data, 0));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 1-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* Try to multiply 1 point, but callback returns false */
        CHECK(!ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_false_callback, &data, 1));

        /* 2-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 2-point with G scalar */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[1], ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check infinite outputs of various forms */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        size_t i, j;
        size_t sizes[] = { 2, 10, 32 };

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_scalar_order(&sc[i]);
                secp256k1_ge_set_infinity(&pt[i]);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_ge_test(&ptg);
                pt[i] = ptg;
                secp256k1_scalar_set_int(&sc[i], 0);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            testutil_random_ge_test(&ptg);
            for (i = 0; i < 16; i++) {
                testutil_random_scalar_order(&sc[2*i]);
                secp256k1_scalar_negate(&sc[2*i + 1], &sc[2*i]);
                pt[2 * i] = ptg;
                pt[2 * i + 1] = ptg;
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));

            testutil_random_scalar_order(&sc[0]);
            for (i = 0; i < 16; i++) {
                testutil_random_ge_test(&ptg);

                sc[2*i] = sc[0];
                sc[2*i+1] = sc[0];
                pt[2 * i] = ptg;
                secp256k1_ge_neg(&pt[2*i+1], &pt[2*i]);
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        testutil_random_ge_test(&ptg);
        secp256k1_scalar_set_int(&sc[0], 0);
        pt[0] = ptg;
        for (i = 1; i < 32; i++) {
            pt[i] = ptg;

            testutil_random_scalar_order(&sc[i]);
            secp256k1_scalar_add(&sc[0], &sc[0], &sc[i]);
            secp256k1_scalar_negate(&sc[i], &sc[i]);
        }

        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 32));
        CHECK(secp256k1_gej_is_infinity(&r));
    }

    /* Check random points, constant scalar */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_gej_set_infinity(&r);

        testutil_random_scalar_order(&sc[0]);
        for (i = 0; i < 20; i++) {
            secp256k1_ge ptg;
            sc[i] = sc[0];
            testutil_random_ge_test(&ptg);
            pt[i] = ptg;
            secp256k1_gej_add_ge_var(&r, &r, &pt[i], NULL);
        }

        secp256k1_ecmult(&r2, &r, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check random scalars, constant point */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_ge ptg;
        secp256k1_gej p0j;
        secp256k1_scalar rs;
        secp256k1_scalar_set_int(&rs, 0);

        testutil_random_ge_test(&ptg);
        for (i = 0; i < 20; i++) {
            testutil_random_scalar_order(&sc[i]);
            pt[i] = ptg;
            secp256k1_scalar_add(&rs, &rs, &sc[i]);
        }

        secp256k1_gej_set_ge(&p0j, &pt[0]);
        secp256k1_ecmult(&r2, &p0j, &rs, &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Sanity check that zero scalars don't cause problems */
    for (ncount = 0; ncount < 20; ncount++) {
        testutil_random_scalar_order(&sc[ncount]);
        testutil_random_ge_test(&pt[ncount]);
    }

    secp256k1_scalar_set_int(&sc[0], 0);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
    secp256k1_scalar_set_int(&sc[1], 0);
    secp256k1_scalar_set_int(&sc[2], 0);
    secp256k1_scalar_set_int(&sc[3], 0);
    secp256k1_scalar_set_int(&sc[4], 0);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 6));
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 5));
    CHECK(secp256k1_gej_is_infinity(&r));

    /* Run through s0*(t0*P) + s1*(t1*P) exhaustively for many small values of s0, s1, t0, t1 */
    {
        const size_t TOP = 8;
        size_t s0i, s1i;
        size_t t0i, t1i;
        secp256k1_ge ptg;
        secp256k1_gej ptgj;

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);

        for(t0i = 0; t0i < TOP; t0i++) {
            for(t1i = 0; t1i < TOP; t1i++) {
                secp256k1_gej t0p, t1p;
                secp256k1_scalar t0, t1;

                secp256k1_scalar_set_int(&t0, (t0i + 1) / 2);
                secp256k1_scalar_cond_negate(&t0, t0i & 1);
                secp256k1_scalar_set_int(&t1, (t1i + 1) / 2);
                secp256k1_scalar_cond_negate(&t1, t1i & 1);

                secp256k1_ecmult(&t0p, &ptgj, &t0, &secp256k1_scalar_zero);
                secp256k1_ecmult(&t1p, &ptgj, &t1, &secp256k1_scalar_zero);

                for(s0i = 0; s0i < TOP; s0i++) {
                    for(s1i = 0; s1i < TOP; s1i++) {
                        secp256k1_scalar tmp1, tmp2;
                        secp256k1_gej expected, actual;

                        secp256k1_ge_set_gej(&pt[0], &t0p);
                        secp256k1_ge_set_gej(&pt[1], &t1p);

                        secp256k1_scalar_set_int(&sc[0], (s0i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[0], s0i & 1);
                        secp256k1_scalar_set_int(&sc[1], (s1i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[1], s1i & 1);

                        secp256k1_scalar_mul(&tmp1, &t0, &sc[0]);
                        secp256k1_scalar_mul(&tmp2, &t1, &sc[1]);
                        secp256k1_scalar_add(&tmp1, &tmp1, &tmp2);

                        secp256k1_ecmult(&expected, &ptgj, &tmp1, &secp256k1_scalar_zero);
                        CHECK(ecmult_multi(&CTX->error_callback, scratch, &actual, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
                        CHECK(secp256k1_gej_eq_var(&actual, &expected));
                    }
                }
            }
        }
    }
}